

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O1

DescriptorFlags __thiscall
Js::SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_true>::GetSetter
          (SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_true> *this,
          DynamicObject *instance,JavascriptString *propertyNameString,Var *setterValue,
          PropertyValueInfo *info,ScriptContext *requestContext)

{
  byte bVar1;
  BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
  *this_00;
  code *pcVar2;
  bool bVar3;
  charcount_t cVar4;
  uint uVar5;
  DescriptorFlags DVar6;
  char16 *pcVar7;
  undefined4 *puVar8;
  Entry<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_Js::SimpleDictionaryPropertyDescriptor<int>_>
  *extraout_RDX;
  Entry<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_Js::SimpleDictionaryPropertyDescriptor<int>_>
  *pEVar9;
  undefined1 local_38 [8];
  CharacterBuffer<char16_t> propertyName;
  
  pcVar7 = JavascriptString::GetString(propertyNameString);
  cVar4 = JavascriptString::GetLength(propertyNameString);
  bVar3 = PropertyRecord::IsPropertyNameNumeric(pcVar7,cVar4);
  if (bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x5e1,
                                "(!PropertyRecord::IsPropertyNameNumeric(propertyNameString->GetString(), propertyNameString->GetLength()))"
                                ,
                                "Numeric property names should have been converted to uint or PropertyRecord* before calling GetSetter"
                               );
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar8 = 0;
  }
  pcVar7 = JavascriptString::GetString(propertyNameString);
  cVar4 = JavascriptString::GetLength(propertyNameString);
  Memory::Recycler::WBSetBit((char *)local_38);
  local_38 = (undefined1  [8])pcVar7;
  Memory::RecyclerWriteBarrierManager::WriteBarrier((CharacterBuffer<char16_t> *)local_38);
  this_00 = (this->propertyMap).ptr;
  propertyName.string.ptr._0_4_ = cVar4;
  uVar5 = JsUtil::
          BaseDictionary<Js::PropertyRecord_const*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::PropertyRecord_const*>::Entry,JsUtil::NoResizeLock>
          ::FindEntryWithKey<JsUtil::CharacterBuffer<char16_t>>
                    ((BaseDictionary<Js::PropertyRecord_const*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::PropertyRecord_const*>::Entry,JsUtil::NoResizeLock>
                      *)this_00,(CharacterBuffer<char16_t> *)local_38);
  pEVar9 = extraout_RDX;
  if (-1 < (int)uVar5) {
    pEVar9 = (this_00->entries).ptr + uVar5;
  }
  DVar6 = None;
  if (((-1 < (int)uVar5) &&
      (bVar1 = *(PropertyAttributes *)
                ((long)&(pEVar9->
                        super_SimpleDictionaryEntry<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_Js::SimpleDictionaryPropertyDescriptor<int>_>
                        ).
                        super_DefaultHashedEntry<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_Js::SimpleDictionaryPropertyDescriptor<int>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                        .
                        super_KeyValueEntry<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_Js::SimpleDictionaryPropertyDescriptor<int>_>
                        .
                        super_ValueEntry<Js::SimpleDictionaryPropertyDescriptor<int>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_Js::SimpleDictionaryPropertyDescriptor<int>_>_>
                        .
                        super_KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_Js::SimpleDictionaryPropertyDescriptor<int>_>
                        .value + 1), DVar6 = None, (bVar1 & 0x18) == 0)) &&
     (DVar6 = WritableData, (bVar1 & 4) == 0)) {
    DVar6 = (uint)(bVar1 >> 7) * 8 + Data;
  }
  return DVar6;
}

Assistant:

DescriptorFlags SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::GetSetter(DynamicObject* instance, JavascriptString* propertyNameString, Var* setterValue, PropertyValueInfo* info, ScriptContext* requestContext)
    {
        AssertMsg(!PropertyRecord::IsPropertyNameNumeric(propertyNameString->GetString(), propertyNameString->GetLength()),
            "Numeric property names should have been converted to uint or PropertyRecord* before calling GetSetter");

        JsUtil::CharacterBuffer<WCHAR> propertyName(propertyNameString->GetString(), propertyNameString->GetLength());
        SimpleDictionaryPropertyDescriptor<TPropertyIndex>* descriptor;
        if (propertyMap->TryGetReference(propertyName, &descriptor))
        {
            return GetSetterFromDescriptor<false>(descriptor);
        }

        return None;
    }